

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O1

double despot::POMCP::Rollout(State *particle,int depth,DSPOMDP *model,POMCPPrior *prior)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  double reward;
  OBS_TYPE obs;
  double local_48;
  double local_40;
  undefined8 local_38;
  
  dVar3 = 0.0;
  if (depth < DAT_00193de0) {
    uVar1 = POMCPPrior::GetAction(prior,particle);
    iVar2 = (*model->_vptr_DSPOMDP[4])(model,particle,(ulong)uVar1,&local_48,&local_38);
    dVar3 = local_48;
    if ((char)iVar2 == '\0') {
      (*prior->_vptr_POMCPPrior[6])(prior,(ulong)uVar1,local_38);
      local_40 = DAT_00193de8;
      dVar3 = Rollout(particle,depth + 1,model,prior);
      local_48 = dVar3 * local_40 + local_48;
      (*prior->_vptr_POMCPPrior[7])(prior);
      dVar3 = local_48;
    }
  }
  return dVar3;
}

Assistant:

double POMCP::Rollout(State* particle, int depth, const DSPOMDP* model,
	POMCPPrior* prior) {
	if (depth >= Globals::config.search_depth) {
		return 0;
	}

	ACT_TYPE action = prior->GetAction(*particle);

	double reward;
	OBS_TYPE obs;
	bool terminal = model->Step(*particle, action, reward, obs);
	if (!terminal) {
		prior->Add(action, obs);
		reward += Globals::Discount() * Rollout(particle, depth + 1, model, prior);
		prior->PopLast();
	}

	return reward;
}